

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterValidator.cpp
# Opt level: O1

Result * CoreML::validateInt64Parameter
                   (Result *__return_storage_ptr__,string *parameterName,
                   Int64Parameter *int64Parameter,bool shouldBePositive)

{
  long lVar1;
  Int64Range *pIVar2;
  long lVar3;
  char cVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  long *plVar8;
  undefined8 *puVar9;
  char cVar10;
  undefined7 in_register_00000009;
  ulong uVar11;
  ulong uVar12;
  size_type *psVar13;
  ulong uVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong __val;
  uint uVar17;
  ulong *puVar18;
  bool bVar19;
  bool bVar20;
  string err;
  string __str;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  uint local_4c;
  ulong *local_48;
  Result *local_40;
  ulong local_38;
  
  uVar11 = CONCAT71(in_register_00000009,shouldBePositive) ^ 1;
  uVar15 = int64Parameter->defaultvalue_;
  cVar10 = (char)uVar11;
  lVar5 = (long)uVar15 >> 0x3f;
  cVar4 = (char)((long)uVar15 >> 0x3f);
  if ((long)uVar15 < 1 && cVar10 == '\0') {
    uVar11 = -uVar15;
    if (0 < (long)uVar15) {
      uVar11 = uVar15;
    }
    uVar17 = 1;
    if (9 < uVar11) {
      uVar15 = uVar11;
      uVar6 = 4;
      do {
        uVar17 = uVar6;
        if (uVar15 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_002a118f;
        }
        if (uVar15 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_002a118f;
        }
        if (uVar15 < 10000) goto LAB_002a118f;
        bVar19 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        uVar6 = uVar17 + 4;
      } while (bVar19);
      uVar17 = uVar17 + 1;
    }
LAB_002a118f:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar17 - cVar4);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_70._M_dataplus._M_p + -lVar5,uVar17,uVar11);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x323c5e);
    psVar13 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_90.field_2._M_allocated_capacity = *psVar13;
      local_90.field_2._8_8_ = plVar8[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar13;
      local_90._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_90._M_string_length = plVar8[1];
    *plVar8 = (long)psVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
    psVar13 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_d0.field_2._M_allocated_capacity = *psVar13;
      local_d0.field_2._8_8_ = plVar8[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar13;
      local_d0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_d0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)(parameterName->_M_dataplus)._M_p);
    psVar13 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_b0.field_2._M_allocated_capacity = *psVar13;
      local_b0.field_2._8_8_ = plVar8[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar13;
      local_b0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_b0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    psVar13 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_f0.field_2._M_allocated_capacity = *psVar13;
      local_f0.field_2._8_8_ = plVar8[3];
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar13;
      local_f0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_f0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_f0);
  }
  else if (int64Parameter->_oneof_case_[0] == 10) {
    pIVar2 = (int64Parameter->AllowedValues_).range_;
    lVar1 = pIVar2->minvalue_;
    if (lVar1 < 1 && cVar10 == '\0') {
      uVar15 = pIVar2->minvalue_;
      uVar11 = -uVar15;
      if (0 < (long)uVar15) {
        uVar11 = uVar15;
      }
      uVar17 = 1;
      if (9 < uVar11) {
        uVar14 = uVar11;
        uVar6 = 4;
        do {
          uVar17 = uVar6;
          if (uVar14 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_002a1570;
          }
          if (uVar14 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_002a1570;
          }
          if (uVar14 < 10000) goto LAB_002a1570;
          bVar19 = 99999 < uVar14;
          uVar14 = uVar14 / 10000;
          uVar6 = uVar17 + 4;
        } while (bVar19);
        uVar17 = uVar17 + 1;
      }
LAB_002a1570:
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_70,(char)uVar17 - (char)((long)uVar15 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_70._M_dataplus._M_p + -((long)uVar15 >> 0x3f),uVar17,uVar11);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x323c96);
      psVar13 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_90.field_2._M_allocated_capacity = *psVar13;
        local_90.field_2._8_8_ = plVar8[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar13;
        local_90._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_90._M_string_length = plVar8[1];
      *plVar8 = (long)psVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
      psVar13 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_d0.field_2._M_allocated_capacity = *psVar13;
        local_d0.field_2._8_8_ = plVar8[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar13;
        local_d0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_d0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_d0,(ulong)(parameterName->_M_dataplus)._M_p);
      psVar13 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_b0.field_2._M_allocated_capacity = *psVar13;
        local_b0.field_2._8_8_ = plVar8[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar13;
        local_b0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_b0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      psVar13 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_f0.field_2._M_allocated_capacity = *psVar13;
        local_f0.field_2._8_8_ = puVar9[3];
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar13;
        local_f0._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_f0._M_string_length = puVar9[1];
      *puVar9 = psVar13;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_f0);
    }
    else {
      lVar3 = pIVar2->maxvalue_;
      if (lVar3 < 1 && cVar10 == '\0') {
        uVar15 = pIVar2->maxvalue_;
        uVar11 = -uVar15;
        if (0 < (long)uVar15) {
          uVar11 = uVar15;
        }
        uVar17 = 1;
        if (9 < uVar11) {
          uVar14 = uVar11;
          uVar6 = 4;
          do {
            uVar17 = uVar6;
            if (uVar14 < 100) {
              uVar17 = uVar17 - 2;
              goto LAB_002a17a3;
            }
            if (uVar14 < 1000) {
              uVar17 = uVar17 - 1;
              goto LAB_002a17a3;
            }
            if (uVar14 < 10000) goto LAB_002a17a3;
            bVar19 = 99999 < uVar14;
            uVar14 = uVar14 / 10000;
            uVar6 = uVar17 + 4;
          } while (bVar19);
          uVar17 = uVar17 + 1;
        }
LAB_002a17a3:
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_70,(char)uVar17 - (char)((long)uVar15 >> 0x3f));
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_70._M_dataplus._M_p + -((long)uVar15 >> 0x3f),uVar17,uVar11);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x323cce);
        psVar13 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_90.field_2._M_allocated_capacity = *psVar13;
          local_90.field_2._8_8_ = plVar8[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar13;
          local_90._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_90._M_string_length = plVar8[1];
        *plVar8 = (long)psVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
        psVar13 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_d0.field_2._M_allocated_capacity = *psVar13;
          local_d0.field_2._8_8_ = plVar8[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar13;
          local_d0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_d0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_d0,(ulong)(parameterName->_M_dataplus)._M_p);
        psVar13 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_b0.field_2._M_allocated_capacity = *psVar13;
          local_b0.field_2._8_8_ = plVar8[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar13;
          local_b0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_b0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        psVar13 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_f0.field_2._M_allocated_capacity = *psVar13;
          local_f0.field_2._8_8_ = puVar9[3];
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar13;
          local_f0._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_f0._M_string_length = puVar9[1];
        *puVar9 = psVar13;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_f0);
      }
      else {
        if (lVar1 <= (long)uVar15 && (long)uVar15 <= lVar3) {
          if (lVar1 <= lVar3) goto LAB_002a154a;
          std::__cxx11::to_string(&local_70,uVar15);
          std::operator+(&local_90,"Specified minimum value (",&local_70);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
          psVar13 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_d0.field_2._M_allocated_capacity = *psVar13;
            local_d0.field_2._8_8_ = plVar8[3];
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar13;
            local_d0._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_d0._M_string_length = plVar8[1];
          *plVar8 = (long)psVar13;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::operator+(&local_b0,&local_d0,parameterName);
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
          psVar13 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_f0.field_2._M_allocated_capacity = *psVar13;
            local_f0.field_2._8_8_ = puVar9[3];
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar13;
            local_f0._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_f0._M_string_length = puVar9[1];
          *puVar9 = psVar13;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
            return __return_storage_ptr__;
          }
          goto LAB_002a13b9;
        }
        uVar11 = -uVar15;
        if (0 < (long)uVar15) {
          uVar11 = uVar15;
        }
        uVar17 = 1;
        if (9 < uVar11) {
          uVar15 = uVar11;
          uVar6 = 4;
          do {
            uVar17 = uVar6;
            if (uVar15 < 100) {
              uVar17 = uVar17 - 2;
              goto LAB_002a1d0c;
            }
            if (uVar15 < 1000) {
              uVar17 = uVar17 - 1;
              goto LAB_002a1d0c;
            }
            if (uVar15 < 10000) goto LAB_002a1d0c;
            bVar19 = 99999 < uVar15;
            uVar15 = uVar15 / 10000;
            uVar6 = uVar17 + 4;
          } while (bVar19);
          uVar17 = uVar17 + 1;
        }
LAB_002a1d0c:
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar17 - cVar4);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_70._M_dataplus._M_p + -lVar5,uVar17,uVar11);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x323c54);
        psVar13 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_90.field_2._M_allocated_capacity = *psVar13;
          local_90.field_2._8_8_ = plVar8[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar13;
          local_90._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_90._M_string_length = plVar8[1];
        *plVar8 = (long)psVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
        psVar13 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_d0.field_2._M_allocated_capacity = *psVar13;
          local_d0.field_2._8_8_ = plVar8[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar13;
          local_d0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_d0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_d0,(ulong)(parameterName->_M_dataplus)._M_p);
        psVar13 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_b0.field_2._M_allocated_capacity = *psVar13;
          local_b0.field_2._8_8_ = plVar8[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar13;
          local_b0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_b0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        psVar13 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_f0.field_2._M_allocated_capacity = *psVar13;
          local_f0.field_2._8_8_ = puVar9[3];
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar13;
          local_f0._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_f0._M_string_length = puVar9[1];
        *puVar9 = psVar13;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_f0);
      }
    }
  }
  else {
    if (int64Parameter->_oneof_case_[0] != 0xb) {
LAB_002a154a:
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    lVar1 = ((int64Parameter->AllowedValues_).range_)->maxvalue_;
    puVar18 = (ulong *)(lVar1 + 8);
    if (lVar1 == 0) {
      puVar18 = (ulong *)0x0;
    }
    puVar16 = (ulong *)(lVar1 + 8 +
                       (long)(int)((int64Parameter->AllowedValues_).range_)->minvalue_ * 8);
    if (lVar1 == 0) {
      puVar16 = (ulong *)0x0;
    }
    if (puVar18 == puVar16) {
      bVar20 = true;
      bVar19 = true;
    }
    else {
      uVar14 = 0;
      local_4c = (uint)uVar11;
      local_48 = puVar16;
      local_40 = __return_storage_ptr__;
      do {
        iVar7 = 0;
        if (*puVar18 == uVar15) {
          iVar7 = 2;
          bVar19 = false;
          uVar14 = CONCAT71((int7)(uVar14 >> 8),1);
        }
        else {
          bVar19 = true;
          if ((long)*puVar18 < 1 && (char)uVar11 == '\0') {
            uVar11 = *puVar18;
            __val = -uVar11;
            if (0 < (long)uVar11) {
              __val = uVar11;
            }
            uVar17 = 1;
            if (9 < __val) {
              uVar12 = __val;
              uVar6 = 4;
              do {
                uVar17 = uVar6;
                if (uVar12 < 100) {
                  uVar17 = uVar17 - 2;
                  goto LAB_002a0dc9;
                }
                if (uVar12 < 1000) {
                  uVar17 = uVar17 - 1;
                  goto LAB_002a0dc9;
                }
                if (uVar12 < 10000) goto LAB_002a0dc9;
                bVar19 = 99999 < uVar12;
                uVar12 = uVar12 / 10000;
                uVar6 = uVar17 + 4;
              } while (bVar19);
              uVar17 = uVar17 + 1;
            }
LAB_002a0dc9:
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            local_38 = uVar14;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_70,(char)uVar17 - (char)((long)uVar11 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long>
                      (local_70._M_dataplus._M_p + -((long)uVar11 >> 0x3f),uVar17,__val);
            plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x323c0f);
            __return_storage_ptr__ = local_40;
            psVar13 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_90.field_2._M_allocated_capacity = *psVar13;
              local_90.field_2._8_8_ = plVar8[3];
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            }
            else {
              local_90.field_2._M_allocated_capacity = *psVar13;
              local_90._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_90._M_string_length = plVar8[1];
            *plVar8 = (long)psVar13;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
            psVar13 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_d0.field_2._M_allocated_capacity = *psVar13;
              local_d0.field_2._8_8_ = plVar8[3];
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *psVar13;
              local_d0._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_d0._M_string_length = plVar8[1];
            *plVar8 = (long)psVar13;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_d0,(ulong)(parameterName->_M_dataplus)._M_p);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            psVar13 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_b0.field_2._M_allocated_capacity = *psVar13;
              local_b0.field_2._8_8_ = plVar8[3];
            }
            else {
              local_b0.field_2._M_allocated_capacity = *psVar13;
              local_b0._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_b0._M_string_length = plVar8[1];
            *plVar8 = (long)psVar13;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            psVar13 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_f0.field_2._M_allocated_capacity = *psVar13;
              local_f0.field_2._8_8_ = plVar8[3];
            }
            else {
              local_f0.field_2._M_allocated_capacity = *psVar13;
              local_f0._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_f0._M_string_length = plVar8[1];
            *plVar8 = (long)psVar13;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            iVar7 = 1;
            bVar19 = false;
            uVar11 = (ulong)local_4c;
            puVar16 = local_48;
            uVar14 = local_38;
          }
        }
        if (!bVar19) goto LAB_002a1058;
        puVar18 = puVar18 + 1;
      } while (puVar18 != puVar16);
      iVar7 = 2;
LAB_002a1058:
      bVar19 = iVar7 == 2;
      bVar20 = (uVar14 & 1) == 0;
    }
    if (!bVar19) {
      return __return_storage_ptr__;
    }
    if (!bVar20) goto LAB_002a154a;
    uVar11 = -uVar15;
    if (0 < (long)uVar15) {
      uVar11 = uVar15;
    }
    uVar17 = 1;
    if (9 < uVar11) {
      uVar15 = uVar11;
      uVar6 = 4;
      do {
        uVar17 = uVar6;
        if (uVar15 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_002a19c7;
        }
        if (uVar15 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_002a19c7;
        }
        if (uVar15 < 10000) goto LAB_002a19c7;
        bVar19 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        uVar6 = uVar17 + 4;
      } while (bVar19);
      uVar17 = uVar17 + 1;
    }
LAB_002a19c7:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar17 - cVar4);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_70._M_dataplus._M_p + -lVar5,uVar17,uVar11);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x323c54);
    psVar13 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_90.field_2._M_allocated_capacity = *psVar13;
      local_90.field_2._8_8_ = plVar8[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar13;
      local_90._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_90._M_string_length = plVar8[1];
    *plVar8 = (long)psVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
    psVar13 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_d0.field_2._M_allocated_capacity = *psVar13;
      local_d0.field_2._8_8_ = plVar8[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar13;
      local_d0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_d0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)(parameterName->_M_dataplus)._M_p);
    psVar13 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_b0.field_2._M_allocated_capacity = *psVar13;
      local_b0.field_2._8_8_ = plVar8[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar13;
      local_b0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_b0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    psVar13 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_f0.field_2._M_allocated_capacity = *psVar13;
      local_f0.field_2._8_8_ = puVar9[3];
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar13;
      local_f0._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_f0._M_string_length = puVar9[1];
    *puVar9 = psVar13;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
    return __return_storage_ptr__;
  }
LAB_002a13b9:
  operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Result CoreML::validateInt64Parameter(const std::string& parameterName, const Specification::Int64Parameter& int64Parameter, bool shouldBePositive) {

    const ::google::protobuf::int64 defaultValue = int64Parameter.defaultvalue();

    if (shouldBePositive) {
        if (defaultValue <= 0) {
            std::string err = "Default Value (" + std::to_string(defaultValue) + ") for '" + parameterName + "' expected to be a positive value.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
    }

    if (int64Parameter.has_set()) {
        bool valueFoundInSet = false;
        for (const auto &value : int64Parameter.set().values()) {
            if (value == defaultValue) {
                valueFoundInSet = true;
                break;
            }
            if (value <= 0 && shouldBePositive) {
                std::string err = "Non-positive value (" + std::to_string(value) + ") in Allowed Values Set for '" + parameterName + "' is not allowed.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
        }
        if (false == valueFoundInSet) {
            std::string err = "Specified Default Value (" + std::to_string(defaultValue) + ") not found in Allowed Values Set for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
    }
    else if (int64Parameter.has_range()) {
        const Specification::Int64Range& range = int64Parameter.range();

        if (range.minvalue() <= 0 && shouldBePositive) {
            std::string err = "Non-positive min value (" + std::to_string(range.minvalue()) + ") in Allowed Value Range for '" + parameterName + "' is not allowed.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (range.maxvalue() <= 0 && shouldBePositive) {
            std::string err = "Non-positive max value (" + std::to_string(range.maxvalue()) + ") in Allowed Value Range for '" + parameterName + "' is not allowed.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (defaultValue < range.minvalue() || defaultValue > range.maxvalue()) {
            std::string err = "Specified Default Value (" + std::to_string(defaultValue) + ") out of Allowed Value Range for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (range.minvalue() > range.maxvalue()) {
            std::string err = "Specified minimum value (" + std::to_string(defaultValue) + ") greater than maximum value for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);

        }
    }

    return Result();
}